

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileType<int>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> s;
  undefined8 local_18;
  
  local_18 = 0;
  CompiledMixedType<int,char>();
  CompiledMixedType<int,signed_char>();
  CompiledMixedType<int,unsigned_char>();
  CompiledMixedType<int,short>();
  CompiledMixedType<int,unsigned_short>();
  CompiledMixedType<int,int>();
  CompiledMixedType<int,unsigned_int>();
  CompiledMixedType<int,long>();
  CompiledMixedType<int,unsigned_long>();
  CompiledMixedType<int,long_long>();
  CompiledMixedType<int,unsigned_long_long>();
  ModulusFriendTest<int,char>();
  ModulusFriendTest<int,signed_char>();
  ModulusFriendTest<int,unsigned_char>();
  ModulusFriendTest<int,short>();
  ModulusFriendTest<int,unsigned_short>();
  ModulusFriendTest<int,int>();
  ModulusFriendTest<int,unsigned_int>();
  ModulusFriendTest<int,long>();
  ModulusFriendTest<int,unsigned_long>();
  ModulusFriendTest<int,long_long>();
  ModulusFriendTest<int,unsigned_long_long>();
  SafeInt::operator_cast_to_unsigned_long((SafeInt *)((long)&local_18 + 4));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_18,0);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_18);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_18,0);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_18);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}